

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

integerPart __thiscall llvm::detail::IEEEFloat::addSignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  uint parts_00;
  integerPart *dst;
  integerPart *rhs_00;
  WordType WVar1;
  integerPart *parts;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  dst = significandParts(this);
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x397,
                  "IEEEFloat::integerPart llvm::detail::IEEEFloat::addSignificand(const IEEEFloat &)"
                 );
  }
  if (this->exponent == rhs->exponent) {
    rhs_00 = significandParts(rhs);
    parts_00 = partCount(this);
    WVar1 = APInt::tcAdd(dst,rhs_00,0,parts_00);
    return WVar1;
  }
  __assert_fail("exponent == rhs.exponent",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x398,
                "IEEEFloat::integerPart llvm::detail::IEEEFloat::addSignificand(const IEEEFloat &)")
  ;
}

Assistant:

IEEEFloat::integerPart IEEEFloat::addSignificand(const IEEEFloat &rhs) {
  integerPart *parts;

  parts = significandParts();

  assert(semantics == rhs.semantics);
  assert(exponent == rhs.exponent);

  return APInt::tcAdd(parts, rhs.significandParts(), 0, partCount());
}